

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimEvalRemapping
              (Sfm_Tim_t *p,Vec_Int_t *vFanins,Vec_Int_t *vMap,Mio_Gate_t *pGate1,char *pFans1,
              Mio_Gate_t *pGate2,char *pFans2)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int **ppiVar4;
  ulong uVar5;
  ulong uVar6;
  int TimeOut [2] [2];
  int *pTimesIn2 [6];
  int *pTimesIn1 [6];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  Mio_Gate_t *local_a0;
  undefined8 local_98 [6];
  
  local_a0 = pGate1;
  uVar1 = Mio_GateReadPinNum(pGate1);
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar2 = Vec_IntEntry(vFanins,(int)pFans1[uVar6]);
    iVar2 = Vec_IntEntry(vMap,iVar2);
    piVar3 = Sfm_TimArrId(p,iVar2);
    *(int **)(&stack0xffffffffffffff98 + uVar6 * 8) = piVar3;
  }
  Sfm_TimGateArrival((Sfm_Tim_t *)local_a0,(Mio_Gate_t *)&stack0xffffffffffffff98,(int **)&local_b8,
                     (int *)pGate1);
  if (pGate2 != (Mio_Gate_t *)0x0) {
    uVar1 = Mio_GateReadPinNum(pGate2);
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      ppiVar4 = (int **)&local_b8;
      if (pFans2[uVar6] != 0x10) {
        iVar2 = Vec_IntEntry(vFanins,(int)pFans2[uVar6]);
        iVar2 = Vec_IntEntry(vMap,iVar2);
        ppiVar4 = (int **)Sfm_TimArrId(p,iVar2);
      }
      local_98[uVar6] = ppiVar4;
    }
    Sfm_TimGateArrival((Sfm_Tim_t *)pGate2,(Mio_Gate_t *)local_98,(int **)&local_b0,(int *)pGate1);
    local_b8 = local_b0;
    local_b4 = local_ac;
  }
  if (local_b4 < local_b8) {
    local_b4 = local_b8;
  }
  return local_b4;
}

Assistant:

int Sfm_TimEvalRemapping( Sfm_Tim_t * p, Vec_Int_t * vFanins, Vec_Int_t * vMap, Mio_Gate_t * pGate1, char * pFans1, Mio_Gate_t * pGate2, char * pFans2 )
{
    int TimeOut[2][2];
    int * pTimesIn1[6], * pTimesIn2[6];
    int i, nFanins1, nFanins2;
    // process the first gate
    nFanins1 = Mio_GateReadPinNum( pGate1 );
    for ( i = 0; i < nFanins1; i++ )
        pTimesIn1[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans1[i])) );
    Sfm_TimGateArrival( p, pGate1, pTimesIn1, TimeOut[0] );
    if ( pGate2 == NULL )
        return Abc_MaxInt(TimeOut[0][0], TimeOut[0][1]);
    // process the second gate
    nFanins2 = Mio_GateReadPinNum( pGate2 );
    for ( i = 0; i < nFanins2; i++ )
        if ( (int)pFans2[i] == 16 )
            pTimesIn2[i] = TimeOut[0];
        else
            pTimesIn2[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans2[i])) );
    Sfm_TimGateArrival( p, pGate2, pTimesIn2, TimeOut[1] );
    return Abc_MaxInt(TimeOut[1][0], TimeOut[1][1]);
}